

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeTemp(Parse *pParse,Expr *pExpr,int *pReg)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ExprList_item *pEVar5;
  Walker WStack_58;
  
  if (pExpr != (Expr *)0x0) {
    do {
      if ((pExpr->flags >> 0xc & 1) == 0) goto LAB_00171a90;
      if ((pExpr->flags >> 0x12 & 1) == 0) {
        pEVar5 = (ExprList_item *)&pExpr->pLeft;
      }
      else {
        pEVar5 = ((pExpr->x).pList)->a;
      }
      pExpr = pEVar5->pExpr;
    } while (pExpr != (Expr *)0x0);
  }
  pExpr = (Expr *)0x0;
LAB_00171a90:
  if ((pParse->okConstFactor != '\0') && (pExpr->op != 0xa8)) {
    WStack_58.eCode = '\x02';
    WStack_58.xExprCallback = exprNodeIsConstant;
    WStack_58.xSelectCallback = sqlite3SelectWalkFail;
    WStack_58.u.n = 0;
    walkExpr(&WStack_58,pExpr);
    if (WStack_58.eCode != '\0') {
      *pReg = 0;
      iVar2 = sqlite3ExprCodeAtInit(pParse,pExpr,-1);
      return iVar2;
    }
  }
  if (pParse->nTempReg == '\0') {
    iVar2 = pParse->nMem + 1;
    pParse->nMem = iVar2;
  }
  else {
    bVar1 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar1;
    iVar2 = pParse->aTempReg[bVar1];
  }
  iVar3 = sqlite3ExprCodeTarget(pParse,pExpr,iVar2);
  iVar4 = iVar2;
  if ((iVar3 != iVar2) && (iVar4 = 0, iVar2 != 0)) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = iVar2;
    }
  }
  *pReg = iVar4;
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTemp(Parse *pParse, Expr *pExpr, int *pReg){
  int r2;
  pExpr = sqlite3ExprSkipCollate(pExpr);
  if( ConstFactorOk(pParse)
   && pExpr->op!=TK_REGISTER
   && sqlite3ExprIsConstantNotJoin(pExpr)
  ){
    *pReg  = 0;
    r2 = sqlite3ExprCodeAtInit(pParse, pExpr, -1);
  }else{
    int r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
    if( r2==r1 ){
      *pReg = r1;
    }else{
      sqlite3ReleaseTempReg(pParse, r1);
      *pReg = 0;
    }
  }
  return r2;
}